

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs> __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::next(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
       *this)

{
  bool bVar1;
  Rhs *this_00;
  AbstractingUnifier *unifier;
  long in_RDI;
  TypedTermList TVar2;
  Renaming normalizer;
  Rhs *ld;
  Renaming *norm;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  Renaming *in_stack_ffffffffffffff90;
  TermList in_stack_ffffffffffffff98;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffffc8;
  QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs> local_10;
  
  do {
    bVar1 = hasLeafData((Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
                         *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    in_stack_ffffffffffffff87 = false;
    if (!bVar1) {
      in_stack_ffffffffffffff87 = findNextLeaf(in_stack_ffffffffffffffc8);
    }
  } while ((bool)in_stack_ffffffffffffff87 != false);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>::operator->
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_> *)0x3cafc5);
  this_00 = Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::next
                      ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)0x3cafcd);
  if ((*(byte *)(in_RDI + 0x58) & 1) != 0) {
    norm = (Renaming *)&stack0xffffffffffffffb0;
    Kernel::Renaming::Renaming
              ((Renaming *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    TVar2 = Inferences::ALASCA::Demodulation::Rhs::key(this_00);
    TVar2._sort._content = (uint64_t)TVar2.super_TermList._content;
    TVar2.super_TermList._content = in_stack_ffffffffffffff98._content;
    Kernel::Renaming::normalizeVariables(in_stack_ffffffffffffff90,TVar2);
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::bdRecord((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
                *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               (BacktrackData *)norm);
    *(undefined1 *)(in_RDI + 0xb8) = 1;
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::denormalize((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
                   *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),norm);
    Kernel::Renaming::~Renaming((Renaming *)0x3cb053);
  }
  unifier = RetrievalAlgorithms::
            UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
            ::unifier((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
                       *)0x3cb079);
  QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs>::QueryRes
            (&local_10,unifier,this_00);
  return local_10;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }